

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_dynamic.cpp
# Opt level: O2

void multikey_dynamic<vector_bagwell<unsigned_char*,16u>,unsigned_short>
               (uchar **strings,size_t N,size_t depth)

{
  unsigned_short uVar1;
  uint16_t uVar2;
  size_t N_00;
  size_t N_01;
  size_t N_02;
  uchar **t;
  ulong uVar3;
  uint j;
  long lVar4;
  uchar **t_00;
  uint j_1;
  array<vector_bagwell<unsigned_char_*,_16U>,_3UL> buckets;
  array<unsigned_short,_32UL> cache;
  
  if (N < 10000) {
    mkqsort(strings,(int)N,(int)depth);
    return;
  }
  buckets._M_elems[2]._index_block.
  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buckets._M_elems[2]._insertpos = (uchar **)0x0;
  buckets._M_elems[2]._index_block.
  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  buckets._M_elems[2]._index_block.
  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  buckets._M_elems[1]._insertpos = (uchar **)0x0;
  buckets._M_elems[1]._left_in_block = 0;
  buckets._M_elems[1]._index_block.
  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  buckets._M_elems[1]._index_block.
  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buckets._M_elems[0]._left_in_block = 0;
  buckets._M_elems[1]._index_block.
  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  buckets._M_elems[0]._index_block.
  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buckets._M_elems[0]._insertpos = (uchar **)0x0;
  buckets._M_elems[0]._index_block.
  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  buckets._M_elems[0]._index_block.
  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  buckets._M_elems[2]._left_in_block = 0;
  uVar1 = pseudo_median<unsigned_short>(strings,N,depth);
  t = strings;
  for (uVar3 = 0; uVar3 < (N & 0xffffffffffffffe0); uVar3 = uVar3 + 0x20) {
    for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 1) {
      uVar2 = get_char<unsigned_short>(t[lVar4],depth);
      cache._M_elems[lVar4] = uVar2;
    }
    t_00 = t;
    for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 1) {
      vector_bagwell<unsigned_char_*,_16U>::push_back
                (buckets._M_elems +
                 (ulong)(cache._M_elems[lVar4] == uVar1) +
                 (ulong)(uVar1 < cache._M_elems[lVar4]) * 2,t_00);
      t_00 = t_00 + 1;
    }
    t = t + 0x20;
  }
  for (; uVar3 < N; uVar3 = uVar3 + 1) {
    uVar2 = get_char<unsigned_short>(*t,depth);
    vector_bagwell<unsigned_char_*,_16U>::push_back
              (buckets._M_elems +
               (ulong)(uVar2 == uVar1) + (ulong)(uVar1 <= uVar2 && uVar2 != uVar1) * 2,t);
    t = t + 1;
  }
  N_00 = vector_bagwell<unsigned_char_*,_16U>::size(buckets._M_elems);
  N_01 = vector_bagwell<unsigned_char_*,_16U>::size(buckets._M_elems + 1);
  N_02 = vector_bagwell<unsigned_char_*,_16U>::size(buckets._M_elems + 2);
  if (N_00 + N_01 + N_02 != N) {
    __assert_fail("bucketsize0 + bucketsize1 + bucketsize2 == N",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_dynamic.cpp"
                  ,0x5d,
                  "void multikey_dynamic(unsigned char **, size_t, size_t) [BucketT = vector_bagwell<unsigned char *>, CharT = unsigned short]"
                 );
  }
  if (N_00 != 0) {
    copy<unsigned_char*,16u,unsigned_char**>(buckets._M_elems,strings);
  }
  if (N_01 != 0) {
    copy<unsigned_char*,16u,unsigned_char**>(buckets._M_elems + 1,strings + N_00);
  }
  if (N_02 != 0) {
    copy<unsigned_char*,16u,unsigned_char**>(buckets._M_elems + 2,strings + N_00 + N_01);
  }
  vector_bagwell<unsigned_char_*,_16U>::clear(buckets._M_elems);
  vector_bagwell<unsigned_char_*,_16U>::clear(buckets._M_elems + 1);
  vector_bagwell<unsigned_char_*,_16U>::clear(buckets._M_elems + 2);
  multikey_dynamic<vector_bagwell<unsigned_char*,16u>,unsigned_short>(strings,N_00,depth);
  if ((char)uVar1 != '\0') {
    multikey_dynamic<vector_bagwell<unsigned_char*,16u>,unsigned_short>
              (strings + N_00,N_01,depth + 2);
  }
  multikey_dynamic<vector_bagwell<unsigned_char*,16u>,unsigned_short>
            (strings + N_00 + N_01,N_02,depth);
  std::array<vector_bagwell<unsigned_char_*,_16U>,_3UL>::~array(&buckets);
  return;
}

Assistant:

static void
multikey_dynamic(unsigned char** strings, size_t N, size_t depth)
{
	if (N < 10000) {
		mkqsort(strings, N, depth);
		return;
	}
	std::array<BucketT, 3> buckets;
	CharT partval = pseudo_median<CharT>(strings, N, depth);
	// Use a small cache to reduce memory stalls.
	size_t i=0;
	for (; i < N-N%32; i+=32) {
		std::array<CharT, 32> cache;
		for (unsigned j=0; j<32; ++j) {
			cache[j] = get_char<CharT>(strings[i+j], depth);
		}
		for (unsigned j=0; j<32; ++j) {
			const unsigned b = get_bucket(cache[j], partval);
			buckets[b].push_back(strings[i+j]);
		}
	}
	for (; i < N; ++i) {
		const CharT c = get_char<CharT>(strings[i], depth);
		const unsigned b = get_bucket(c, partval);
		buckets[b].push_back(strings[i]);
	}
	const size_t bucketsize0 = buckets[0].size();
	const size_t bucketsize1 = buckets[1].size();
	const size_t bucketsize2 = buckets[2].size();
	assert(bucketsize0 + bucketsize1 + bucketsize2 == N);
	if (bucketsize0) copy(buckets[0], strings);
	if (bucketsize1) copy(buckets[1], strings+bucketsize0);
	if (bucketsize2) copy(buckets[2], strings+bucketsize0+bucketsize1);
	clear_bucket(buckets[0]);
	clear_bucket(buckets[1]);
	clear_bucket(buckets[2]);
	multikey_dynamic<BucketT, CharT>(strings, bucketsize0, depth);
	if (not is_end(partval))
		multikey_dynamic<BucketT, CharT>(strings+bucketsize0,
				bucketsize1, depth+sizeof(CharT));
	multikey_dynamic<BucketT, CharT>(strings+bucketsize0+bucketsize1,
			bucketsize2, depth);
}